

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solstack.c
# Opt level: O1

_Bool stk_MoveCardFromTo(SolStack_t *sourcePtr,SolStack_t *targetPtr)

{
  ECardFace_t EVar1;
  undefined4 uVar2;
  size_t sVar3;
  undefined4 uVar5;
  ulong uVar4;
  _Bool _Var6;
  
  _Var6 = sourcePtr == (SolStack_t *)0x0;
  if (targetPtr != (SolStack_t *)0x0 && !_Var6) {
    sVar3 = sourcePtr->m_size;
    if (sVar3 != 0) {
      uVar2 = sourcePtr->m_cards[sVar3 - 1].m_type;
      uVar5 = sourcePtr->m_cards[sVar3 - 1].m_color;
      EVar1 = sourcePtr->m_cards[sVar3 - 1].m_face;
      sourcePtr->m_size = sVar3 - 1;
      uVar4 = targetPtr->m_size;
      if (uVar4 < 0x34) {
        targetPtr->m_size = uVar4 + 1;
        targetPtr->m_cards[uVar4].m_type = uVar2;
        targetPtr->m_cards[uVar4].m_color = uVar5;
        targetPtr->m_cards[uVar4].m_face = EVar1;
        _Var6 = true;
        if (sourcePtr->m_size != 0) {
          sourcePtr->m_cards[sourcePtr->m_size - 1].m_face = CF_UP;
        }
      }
      else {
        uVar4 = sourcePtr->m_size;
        if (uVar4 < 0x34) {
          sourcePtr->m_size = uVar4 + 1;
          sourcePtr->m_cards[uVar4].m_type = uVar2;
          sourcePtr->m_cards[uVar4].m_color = uVar5;
          sourcePtr->m_cards[uVar4].m_face = EVar1;
        }
        _Var6 = false;
      }
    }
    if (sVar3 != 0) {
      return _Var6;
    }
  }
  return false;
}

Assistant:

bool stk_MoveCardFromTo(SolStack_t* sourcePtr, SolStack_t* targetPtr)
{
  if (sourcePtr && targetPtr) {
    Card_t card;
    if (stk_Pop(sourcePtr, &card)) {
      if (stk_PushCopy(targetPtr, card)) {
        stk_TurnTopCardUp(sourcePtr);
        return true;
      } else {
        // target stack is probably full, push the card back to source
        stk_PushCopy(sourcePtr, card);
        return false;
      }
    }
  }
  return false;
}